

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::CleanupSourceInfo(FunctionBody *this,bool isScriptContextClosing)

{
  SmallSpanSequence *obj;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->field_0x179 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ceb,"(this->cleanedUp)","this->cleanedUp");
    if (!bVar2) goto LAB_0077bf8d;
    *puVar3 = 0;
  }
  if ((*(uint *)&this->field_0x178 >> 10 & 1) == 0) {
    if ((*(uint *)&this->field_0x178 & 8) != 0 && !isScriptContextClosing) {
      if ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr ==
          (Utf8SourceInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1cf3,"(this->m_utf8SourceInfo)","this->m_utf8SourceInfo");
        if (!bVar2) {
LAB_0077bf8d:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      Utf8SourceInfo::RemoveFunctionBody
                ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,this);
    }
    obj = (this->m_sourceInfo).pSpanSequence;
    if (obj != (SmallSpanSequence *)0x0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
                (&Memory::HeapAllocator::Instance,obj);
      (this->m_sourceInfo).pSpanSequence = (Type)0x0;
    }
    this->field_0x179 = this->field_0x179 | 4;
  }
  return;
}

Assistant:

void FunctionBody::CleanupSourceInfo(bool isScriptContextClosing)
    {
        Assert(this->cleanedUp);

        if (!sourceInfoCleanedUp)
        {
            if (GetIsFuncRegistered() && !isScriptContextClosing)
            {
                // If our function is registered, then there must
                // be a Utf8SourceInfo pinned by it.
                Assert(this->m_utf8SourceInfo);

                this->GetUtf8SourceInfo()->RemoveFunctionBody(this);
            }

            if (this->m_sourceInfo.pSpanSequence != nullptr)
            {
                HeapDelete(this->m_sourceInfo.pSpanSequence);
                this->m_sourceInfo.pSpanSequence = nullptr;
            }

            sourceInfoCleanedUp = true;
        }
    }